

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void open_func(LexState *ls,FuncState *fs)

{
  lua_State *L;
  GCObject *pGVar1;
  GCObject *pGVar2;
  StkId pTVar3;
  
  L = ls->L;
  pGVar1 = (GCObject *)luaF_newproto(L);
  fs->f = (Proto *)pGVar1;
  fs->prev = ls->fs;
  fs->ls = ls;
  fs->L = L;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = -1;
  fs->jpc = -1;
  fs->bl = (BlockCnt *)0x0;
  fs->freereg = 0;
  fs->nk = 0;
  *(undefined8 *)((long)&fs->nk + 3) = 0;
  (pGVar1->p).source = ls->source;
  (pGVar1->p).maxstacksize = '\x02';
  pGVar2 = (GCObject *)luaH_new(L,0,0);
  fs->h = (Table *)pGVar2;
  pTVar3 = L->top;
  (pTVar3->value).gc = pGVar2;
  pTVar3->tt = 5;
  pTVar3 = L->top;
  if ((long)L->stack_last - (long)pTVar3 < 0x11) {
    luaD_growstack(L,1);
    pTVar3 = L->top;
  }
  L->top = pTVar3 + 1;
  pTVar3[1].value.gc = pGVar1;
  pTVar3[1].tt = 9;
  pTVar3 = L->top;
  if ((long)L->stack_last - (long)pTVar3 < 0x11) {
    luaD_growstack(L,1);
    pTVar3 = L->top;
  }
  L->top = pTVar3 + 1;
  return;
}

Assistant:

static void open_func (LexState *ls, FuncState *fs) {
  lua_State *L = ls->L;
  Proto *f = luaF_newproto(L);
  fs->f = f;
  fs->prev = ls->fs;  /* linked list of funcstates */
  fs->ls = ls;
  fs->L = L;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = -1;
  fs->jpc = NO_JUMP;
  fs->freereg = 0;
  fs->nk = 0;
  fs->np = 0;
  fs->nlocvars = 0;
  fs->nactvar = 0;
  fs->bl = NULL;
  f->source = ls->source;
  f->maxstacksize = 2;  /* registers 0/1 are always valid */
  fs->h = luaH_new(L, 0, 0);
  /* anchor table of constants and prototype (to avoid being collected) */
  sethvalue2s(L, L->top, fs->h);
  incr_top(L);
  setptvalue2s(L, L->top, f);
  incr_top(L);
}